

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::RelativeDateFormat::toPattern
          (RelativeDateFormat *this,UnicodeString *result,UErrorCode *status)

{
  ushort uVar1;
  ushort uVar2;
  UnicodeString *srcText;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
    uVar2 = 2;
    if ((uVar1 & 1) == 0) {
      uVar2 = uVar1 & 0x1e;
    }
    (result->fUnion).fStackFields.fLengthAndFlags = uVar2;
    srcText = &this->fTimePattern;
    if ((((ushort)(this->fDatePattern).fUnion.fStackFields.fLengthAndFlags < 0x20) ||
        (srcText = &this->fDatePattern,
        (ushort)(this->fTimePattern).fUnion.fStackFields.fLengthAndFlags < 0x20)) ||
       (this->fCombinedFormat == (SimpleFormatter *)0x0)) {
      icu_63::UnicodeString::setTo(result,srcText);
    }
    else {
      SimpleFormatter::format(this->fCombinedFormat,&this->fTimePattern,srcText,result,status);
    }
  }
  return result;
}

Assistant:

UnicodeString&
RelativeDateFormat::toPattern(UnicodeString& result, UErrorCode& status) const
{
    if (!U_FAILURE(status)) {
        result.remove();
        if (fDatePattern.isEmpty()) {
            result.setTo(fTimePattern);
        } else if (fTimePattern.isEmpty() || fCombinedFormat == NULL) {
            result.setTo(fDatePattern);
        } else {
            fCombinedFormat->format(fTimePattern, fDatePattern, result, status);
        }
    }
    return result;
}